

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateNullAttribsTest::iterate(CreateNullAttribsTest *this)

{
  ostringstream *this_00;
  EGLenum EVar1;
  TestLog *pTVar2;
  int iVar3;
  deUint32 err;
  Library *pLVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  char *__s;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  pLVar4 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*pLVar4->_vptr_Library[0x11])
                    (pLVar4,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar3);
  this_00 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::_M_insert<void_const*>(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = eglCreateSyncKHR(",0x14)
  ;
  std::ostream::_M_insert<void_const*>(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  EVar1 = (this->super_SyncTest).m_syncType;
  pcVar6 = "<Unknown>";
  if (EVar1 == 0x30fa) {
    pcVar6 = "EGL_SYNC_REUSABLE_KHR";
  }
  __s = "EGL_SYNC_FENCE_KHR";
  if (EVar1 != 0x30f9) {
    __s = pcVar6;
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", NULL)",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  err = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x118);
  tcu::TestContext::setTestResult
            ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}